

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O0

void CopyException(EXCEPINFO *peiDest,EXCEPINFO *peiSource)

{
  OLECHAR *pOVar1;
  UINT UVar2;
  BSTR pWVar3;
  EXCEPINFO *peiSource_local;
  EXCEPINFO *peiDest_local;
  
  FreeExcepInfo(peiDest);
  memcpy(peiDest,peiSource,0x40);
  if (peiSource->bstrSource != (BSTR)0x0) {
    pOVar1 = peiSource->bstrSource;
    UVar2 = SysStringLen(peiSource->bstrSource);
    pWVar3 = SysAllocStringLen(pOVar1,UVar2);
    peiDest->bstrSource = pWVar3;
  }
  if (peiSource->bstrDescription != (BSTR)0x0) {
    pOVar1 = peiSource->bstrDescription;
    UVar2 = SysStringLen(peiSource->bstrDescription);
    pWVar3 = SysAllocStringLen(pOVar1,UVar2);
    peiDest->bstrDescription = pWVar3;
  }
  if (peiSource->bstrHelpFile != (BSTR)0x0) {
    pOVar1 = peiSource->bstrHelpFile;
    UVar2 = SysStringLen(peiSource->bstrHelpFile);
    pWVar3 = SysAllocStringLen(pOVar1,UVar2);
    peiDest->bstrHelpFile = pWVar3;
  }
  return;
}

Assistant:

void CopyException (EXCEPINFO *peiDest, const EXCEPINFO *peiSource)
{
    FreeExcepInfo(peiDest);
    *peiDest = *peiSource;
    if (peiSource->bstrSource) {
        peiDest->bstrSource =
            SysAllocStringLen(peiSource->bstrSource, SysStringLen(peiSource->bstrSource));
    }
    if (peiSource->bstrDescription) {
        peiDest->bstrDescription =
            SysAllocStringLen(peiSource->bstrDescription, SysStringLen(peiSource->bstrDescription));
    }
    if (peiSource->bstrHelpFile) {
        peiDest->bstrHelpFile =
            SysAllocStringLen(peiSource->bstrHelpFile, SysStringLen(peiSource->bstrHelpFile));
    }
}